

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void __thiscall gvr::anon_unknown_3::PLYProperty::~PLYProperty(PLYProperty *this)

{
  pointer pcVar1;
  
  if (this->value != (PLYValue *)0x0) {
    (*this->value->_vptr_PLYValue[1])();
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

PLYProperty::~PLYProperty()
{
  delete value;
}